

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

PathTypeMultiSuccessorInfo *
Js::PathTypeMultiSuccessorInfo::New
          (PathTypeSuccessorKey key,RecyclerWeakReference<Js::DynamicType> *typeWeakRef,
          ScriptContext *scriptContext)

{
  Recycler *alloc;
  PathTypeMultiSuccessorInfo *this;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9d33d42;
  data.filename._0_4_ = 0xc1;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_50);
  this = (PathTypeMultiSuccessorInfo *)new<Memory::Recycler>(0x10,alloc,0x38bbb2);
  PathTypeMultiSuccessorInfo(this,scriptContext->recycler,key,typeWeakRef);
  return this;
}

Assistant:

PathTypeMultiSuccessorInfo * PathTypeMultiSuccessorInfo::New(const PathTypeSuccessorKey key, RecyclerWeakReference<DynamicType> * typeWeakRef, ScriptContext * scriptContext)
    {
        return RecyclerNew(scriptContext->GetRecycler(), PathTypeMultiSuccessorInfo, scriptContext->GetRecycler(), key, typeWeakRef);
    }